

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  int iVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  size_t sVar10;
  cmGeneratorExpressionInterpreter *this;
  cmLocalGenerator *pcVar11;
  char *pcVar12;
  ostream *poVar13;
  char *__s;
  bool bVar14;
  pair<bool,_const_char_*> pVar15;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2f0;
  cmGeneratorExpressionInterpreter *local_2e0;
  cmGeneratorTarget *local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290;
  cmLocalGenerator *local_270;
  _Base_ptr local_268;
  _Base_ptr local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *local_250;
  cmLocalGenerator *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_220;
  undefined1 local_200 [112];
  ios_base local_190 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_250 = defaultValue;
  local_2f0 = cmGeneratorTarget::GetProperty(tgt,p);
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar14 = _Var7._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_258 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_268 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_260 != local_268 &&
      _Var7._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_2d8 = tgt;
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0," * Target \"","");
    psVar9 = cmTarget::GetName_abi_cxx11_(local_2d8->Target);
    std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(psVar9->_M_dataplus)._M_p);
    if (_Var7._M_current != local_258) {
      std::__cxx11::string::append((char *)&local_2b0);
      pcVar12 = "(unset)";
      if (local_2f0 != (char *)0x0) {
        pcVar12 = local_2f0;
      }
      local_200._0_8_ = local_200 + 0x10;
      sVar10 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar12,pcVar12 + sVar10);
      std::__cxx11::string::_M_append((char *)&local_2b0,local_200._0_8_);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_2b0);
    local_240 = _Var7._M_current;
    std::operator+(&local_88,"INTERFACE_",p);
    iVar5 = std::__cxx11::string::compare((char *)p);
    if (iVar5 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      pcVar2 = local_2d8;
      local_270 = local_2d8->LocalGenerator;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,pcVar1,pcVar1 + config->_M_string_length);
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,local_270,&local_220,pcVar2,&local_68);
      local_2e0 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_2e0 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    if ((iVar5 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2)) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    pcVar11 = (cmLocalGenerator *)
              (pvVar8->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_248 = (cmLocalGenerator *)
                (pvVar8->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar11 != local_248) {
      do {
        pcVar2 = (cmGeneratorTarget *)((cmStateSnapshot *)&pcVar11->_vptr_cmLocalGenerator)->State;
        local_270 = pcVar11;
        pcVar6 = cmTarget::GetProperties(pcVar2->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_238,pcVar6);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_238.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_88);
        pbVar4 = local_238.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar12 = getTypedProperty<char_const*>(pcVar2,&local_88,local_2e0);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        local_2d0._M_string_length = 0;
        local_2d0.field_2._M_local_buf[0] = '\0';
        if (_Var7._M_current != pbVar4) {
          std::__cxx11::string::append((char *)&local_2d0);
          psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
          std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_2d0);
          __s = pcVar12;
          if (pcVar12 == (char *)0x0) {
            __s = "(unset)";
          }
          local_200._0_8_ = local_200 + 0x10;
          sVar10 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_200,__s,__s + sVar10);
          std::__cxx11::string::_M_append((char *)&local_2d0,local_200._0_8_);
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_2d0);
        }
        if (local_240 == local_258) {
          if (local_260 == local_268) {
            if (_Var7._M_current == pbVar4) goto LAB_002d234d;
            if (bVar14) {
              pVar15 = consistentProperty<char_const*>(local_2f0,pcVar12,t);
              pcVar12 = pVar15.second;
              std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_200,t,local_2f0 != pcVar12);
              std::__cxx11::string::_M_append((char *)&local_2b0,local_200._0_8_);
              if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              }
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"The INTERFACE_",0xe);
                pcVar3 = local_2d8;
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," property of \"",0xe);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\" does\nnot agree with the value of ",0x23);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13," already determined\nfor \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_290);
                goto LAB_002d2153;
              }
              goto LAB_002d1ee4;
            }
            local_200._0_8_ = local_200 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_200,local_2d0._M_dataplus._M_p,
                       local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
            std::__cxx11::string::append((char *)local_200);
            std::__cxx11::string::_M_append((char *)&local_2b0,local_200._0_8_);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            }
            iVar5 = 0;
            bVar14 = true;
            local_2f0 = pcVar12;
          }
          else {
            iVar5 = 3;
            if (_Var7._M_current == pbVar4) {
              local_2f0 = "";
LAB_002d234d:
              iVar5 = 3;
            }
            else {
              pVar15 = consistentProperty<char_const*>("",pcVar12,t);
              std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_((string *)local_200,t,pVar15.second != "");
              std::__cxx11::string::_M_append((char *)&local_2b0,local_200._0_8_);
              if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              }
              local_2f0 = pVar15.second;
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"Property ",9);
                pcVar3 = local_2d8;
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," on target \"",0xc);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\" is\nimplied to be ",0x13);
                pcVar12 = local_250;
                if (local_250 == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)poVar13->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar10 = strlen(local_250);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13," property on\ndependency \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_290);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  local_290.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                std::ios_base::~ios_base(local_190);
                iVar5 = 2;
                local_2f0 = "";
              }
            }
          }
        }
        else {
          if (_Var7._M_current == pbVar4) goto LAB_002d234d;
          pVar15 = consistentProperty<char_const*>(local_2f0,pcVar12,t);
          pcVar12 = pVar15.second;
          std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_((string *)local_200,t,local_2f0 != pcVar12);
          std::__cxx11::string::_M_append((char *)&local_2b0,local_200._0_8_);
          if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          }
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Property ",9);
            pcVar3 = local_2d8;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," on target \"",0xc);
            psVar9 = cmTarget::GetName_abi_cxx11_(pcVar3->Target);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"\" does\nnot match the INTERFACE_",0x1f);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13," property requirement\nof dependency \"",0x25);
            psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_290);
LAB_002d2153:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
            std::ios_base::~ios_base(local_190);
            iVar5 = 2;
          }
          else {
LAB_002d1ee4:
            iVar5 = 3;
            local_2f0 = pcVar12;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                   local_2d0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_238);
      } while (((iVar5 == 3) || (iVar5 == 0)) &&
              (pcVar11 = (cmLocalGenerator *)&local_270->super_cmOutputConverter,
              pcVar11 != local_248));
    }
    pcVar12 = "(unset)";
    if (local_2f0 != (char *)0x0) {
      pcVar12 = local_2f0;
    }
    local_200._0_8_ = local_200 + 0x10;
    sVar10 = strlen(pcVar12);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar12,pcVar12 + sVar10);
    compatibilityType_abi_cxx11_(&local_2d0,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_2d8,p,(string *)local_200,&local_2b0,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                               local_2d0.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_2e0 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2e0,local_2e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2f0;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}